

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int dtype_convert_simple(void *dst,char *dstdtype,void *src,char *srcdtype,size_t nmemb)

{
  int iVar1;
  undefined1 local_6a0 [8];
  BigArrayIter src_iter;
  BigArrayIter dst_iter;
  BigArray src_array;
  BigArray dst_array;
  size_t nmemb_local;
  char *srcdtype_local;
  void *src_local;
  char *dstdtype_local;
  void *dst_local;
  
  dst_array.data = (void *)nmemb;
  big_array_init((BigArray *)&src_array.data,dst,dstdtype,1,(size_t *)&dst_array.data,
                 (ptrdiff_t *)0x0);
  big_array_init((BigArray *)&dst_iter.dataptr,src,srcdtype,1,(size_t *)&dst_array.data,
                 (ptrdiff_t *)0x0);
  big_array_iter_init((BigArrayIter *)&src_iter.dataptr,(BigArray *)&src_array.data);
  big_array_iter_init((BigArrayIter *)local_6a0,(BigArray *)&dst_iter.dataptr);
  iVar1 = _dtype_convert((BigArrayIter *)&src_iter.dataptr,(BigArrayIter *)local_6a0,
                         (size_t)dst_array.data);
  return iVar1;
}

Assistant:

static int
dtype_convert_simple(void * dst, const char * dstdtype, const void * src, const char * srcdtype, size_t nmemb)
{
    BigArray dst_array, src_array;
    BigArrayIter dst_iter, src_iter;
    big_array_init(&dst_array, dst, dstdtype, 1, &nmemb, NULL);
    big_array_init(&src_array, (void*) src, srcdtype, 1, &nmemb, NULL);
    big_array_iter_init(&dst_iter, &dst_array);
    big_array_iter_init(&src_iter, &src_array);
    return _dtype_convert(&dst_iter, &src_iter, nmemb);
}